

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

void duckdb::JulianDayFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_361;
  LogicalType local_360 [24];
  code *local_348;
  undefined8 uStack_340;
  code *local_338;
  code *pcStack_330;
  code *local_328;
  undefined8 uStack_320;
  code *local_318;
  code *pcStack_310;
  LogicalType local_308 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2f0;
  LogicalType local_2d8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2c0;
  LogicalType local_2a8 [24];
  LogicalType local_290 [24];
  ScalarFunction local_278;
  ScalarFunction local_150;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_360,DATE);
  __l._M_len = 1;
  __l._M_array = local_360;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2c0,__l,&local_361);
  duckdb::LogicalType::LogicalType(local_2d8,DOUBLE);
  uStack_320 = 0;
  local_328 = DatePart::UnaryFunction<duckdb::date_t,double,duckdb::DatePart::JulianDayOperator>;
  pcStack_310 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_318 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_290,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_150,&local_2c0,local_2d8,&local_328,0,0,
             DatePart::JulianDayOperator::PropagateStatistics<duckdb::date_t>,0,local_290,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_150);
  local_150._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_150 + 0xb0U),(_Any_data *)((long)&local_150 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_290);
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,3);
  }
  duckdb::LogicalType::~LogicalType(local_2d8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2c0);
  duckdb::LogicalType::~LogicalType(local_360);
  duckdb::LogicalType::LogicalType(local_360,TIMESTAMP);
  __l_00._M_len = 1;
  __l_00._M_array = local_360;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2f0,__l_00,&local_361);
  duckdb::LogicalType::LogicalType(local_308,DOUBLE);
  uStack_340 = 0;
  local_348 = DatePart::
              UnaryFunction<duckdb::timestamp_t,double,duckdb::DatePart::JulianDayOperator>;
  pcStack_330 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_338 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2a8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_278,&local_2f0,local_308,&local_348,0,0,
             DatePart::JulianDayOperator::PropagateStatistics<duckdb::timestamp_t>,0,local_2a8,0,0,0
            );
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_278);
  local_278._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_278.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_278.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_278.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_278 + 0xb0U),(_Any_data *)((long)&local_278 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_278.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_2a8);
  if (local_338 != (code *)0x0) {
    (*local_338)(&local_348,&local_348,3);
  }
  duckdb::LogicalType::~LogicalType(local_308);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2f0);
  duckdb::LogicalType::~LogicalType(local_360);
  return;
}

Assistant:

ScalarFunctionSet JulianDayFun::GetFunctions() {
	using OP = DatePart::JulianDayOperator;

	ScalarFunctionSet operator_set;
	auto date_func = DatePart::UnaryFunction<date_t, double, OP>;
	auto date_stats = OP::template PropagateStatistics<date_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::DATE}, LogicalType::DOUBLE, date_func, nullptr, nullptr, date_stats));
	auto ts_func = DatePart::UnaryFunction<timestamp_t, double, OP>;
	auto ts_stats = OP::template PropagateStatistics<timestamp_t>;
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::TIMESTAMP}, LogicalType::DOUBLE, ts_func, nullptr, nullptr, ts_stats));

	return operator_set;
}